

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvlist.c
# Opt level: O0

nvlist_t * nvlist_get_parent(nvlist_t *nvl,void **cookiep)

{
  nvpair_t *nvp_00;
  nvpair_t *nvp;
  void **cookiep_local;
  nvlist_t *nvl_local;
  
  if (nvl == (nvlist_t *)0x0) {
    __assert_fail("(nvl) != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                  ,0xc5,"const nvlist_t *nvlist_get_parent(const nvlist_t *, void **)");
  }
  if (nvl->nvl_magic == 0x6e766c) {
    nvp_00 = nvl->nvl_parent;
    if (cookiep != (void **)0x0) {
      *cookiep = nvp_00;
    }
    if (nvp_00 == (nvpair_t *)0x0) {
      nvl_local = (nvlist_t *)0x0;
    }
    else {
      nvl_local = nvpair_nvlist(nvp_00);
    }
    return nvl_local;
  }
  __assert_fail("(nvl)->nvl_magic == 0x6e766c",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                ,0xc5,"const nvlist_t *nvlist_get_parent(const nvlist_t *, void **)");
}

Assistant:

const nvlist_t *
nvlist_get_parent(const nvlist_t *nvl, void **cookiep)
{
	nvpair_t *nvp;

	NVLIST_ASSERT(nvl);

	nvp = nvl->nvl_parent;
	if (cookiep != NULL)
		*cookiep = nvp;
	if (nvp == NULL)
		return (NULL);

	return (nvpair_nvlist(nvp));
}